

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O3

void luaT_getvarargs(lua_State *L,CallInfo *ci,StkId where,int wanted)

{
  StkId pSVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 *puVar30;
  long lVar31;
  ulong uVar32;
  uint n;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  int iVar57;
  int iVar58;
  undefined1 auVar55 [16];
  int iVar59;
  undefined1 auVar56 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar73;
  int iVar77;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  
  n = (ci->u).l.nextraargs;
  lVar33 = (long)(int)n;
  if (wanted < 0) {
    if ((long)(L->stack_last).p - (L->top).offset >> 4 <= lVar33) {
      lVar31 = (L->stack).offset;
      if (0 < L->l_G->GCdebt) {
        luaC_step(L);
      }
      luaD_growstack(L,n,1);
      where = (StkId)(((long)where - lVar31) + (long)(L->stack).p);
    }
    (L->top).p = where + lVar33;
    wanted = n;
  }
  if (wanted < (int)n) {
    n = wanted;
  }
  if ((int)n < 1) {
    n = 0;
  }
  else {
    lVar33 = lVar33 * -0x10 + 8;
    lVar31 = 0;
    do {
      pSVar1 = (ci->func).p;
      *(undefined8 *)((long)where + lVar31) = *(undefined8 *)((long)pSVar1 + lVar31 + -8 + lVar33);
      *(undefined1 *)((long)where + lVar31 + 8) = *(undefined1 *)((long)pSVar1 + lVar31 + lVar33);
      lVar31 = lVar31 + 0x10;
    } while ((ulong)n << 4 != lVar31);
  }
  auVar29 = _DAT_0011fed0;
  auVar28 = _DAT_0011fec0;
  auVar27 = _DAT_0011feb0;
  auVar26 = _DAT_0011fea0;
  auVar25 = _DAT_0011fe90;
  auVar24 = _DAT_0011fe80;
  auVar23 = _DAT_0011fe70;
  if ((int)n < wanted) {
    lVar33 = (ulong)(uint)wanted - (ulong)n;
    lVar31 = lVar33 + -1;
    auVar34._8_4_ = (int)lVar31;
    auVar34._0_8_ = lVar31;
    auVar34._12_4_ = (int)((ulong)lVar31 >> 0x20);
    puVar30 = (undefined1 *)((long)where + (ulong)n * 0x10 + 0xf8);
    uVar32 = 0;
    do {
      auVar52._8_4_ = (int)uVar32;
      auVar52._0_8_ = uVar32;
      auVar52._12_4_ = (int)(uVar32 >> 0x20);
      auVar55 = auVar34 ^ auVar29;
      auVar60 = (auVar52 | auVar28) ^ auVar29;
      iVar54 = auVar55._0_4_;
      iVar73 = -(uint)(iVar54 < auVar60._0_4_);
      iVar57 = auVar55._4_4_;
      auVar62._4_4_ = -(uint)(iVar57 < auVar60._4_4_);
      iVar58 = auVar55._8_4_;
      iVar77 = -(uint)(iVar58 < auVar60._8_4_);
      iVar59 = auVar55._12_4_;
      auVar62._12_4_ = -(uint)(iVar59 < auVar60._12_4_);
      auVar35._4_4_ = iVar73;
      auVar35._0_4_ = iVar73;
      auVar35._8_4_ = iVar77;
      auVar35._12_4_ = iVar77;
      auVar35 = pshuflw(in_XMM1,auVar35,0xe8);
      auVar61._4_4_ = -(uint)(auVar60._4_4_ == iVar57);
      auVar61._12_4_ = -(uint)(auVar60._12_4_ == iVar59);
      auVar61._0_4_ = auVar61._4_4_;
      auVar61._8_4_ = auVar61._12_4_;
      auVar44 = pshuflw(in_XMM2,auVar61,0xe8);
      auVar62._0_4_ = auVar62._4_4_;
      auVar62._8_4_ = auVar62._12_4_;
      auVar60 = pshuflw(auVar35,auVar62,0xe8);
      auVar55._8_4_ = 0xffffffff;
      auVar55._0_8_ = 0xffffffffffffffff;
      auVar55._12_4_ = 0xffffffff;
      auVar55 = (auVar60 | auVar44 & auVar35) ^ auVar55;
      auVar55 = packssdw(auVar55,auVar55);
      if ((auVar55 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar30[-0xf0] = 0;
      }
      auVar44._4_4_ = iVar73;
      auVar44._0_4_ = iVar73;
      auVar44._8_4_ = iVar77;
      auVar44._12_4_ = iVar77;
      auVar62 = auVar61 & auVar44 | auVar62;
      auVar55 = packssdw(auVar62,auVar62);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55 ^ auVar60,auVar55 ^ auVar60);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55._0_4_ >> 8 & 1) != 0) {
        puVar30[-0xe0] = 0;
      }
      auVar55 = (auVar52 | auVar27) ^ auVar29;
      auVar45._0_4_ = -(uint)(iVar54 < auVar55._0_4_);
      auVar45._4_4_ = -(uint)(iVar57 < auVar55._4_4_);
      auVar45._8_4_ = -(uint)(iVar58 < auVar55._8_4_);
      auVar45._12_4_ = -(uint)(iVar59 < auVar55._12_4_);
      auVar63._4_4_ = auVar45._0_4_;
      auVar63._0_4_ = auVar45._0_4_;
      auVar63._8_4_ = auVar45._8_4_;
      auVar63._12_4_ = auVar45._8_4_;
      iVar73 = -(uint)(auVar55._4_4_ == iVar57);
      iVar77 = -(uint)(auVar55._12_4_ == iVar59);
      auVar11._4_4_ = iVar73;
      auVar11._0_4_ = iVar73;
      auVar11._8_4_ = iVar77;
      auVar11._12_4_ = iVar77;
      auVar74._4_4_ = auVar45._4_4_;
      auVar74._0_4_ = auVar45._4_4_;
      auVar74._8_4_ = auVar45._12_4_;
      auVar74._12_4_ = auVar45._12_4_;
      auVar55 = auVar11 & auVar63 | auVar74;
      auVar55 = packssdw(auVar55,auVar55);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55 ^ auVar2,auVar55 ^ auVar2);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55._0_4_ >> 0x10 & 1) != 0) {
        puVar30[-0xd0] = 0;
      }
      auVar55 = pshufhw(auVar55,auVar63,0x84);
      auVar12._4_4_ = iVar73;
      auVar12._0_4_ = iVar73;
      auVar12._8_4_ = iVar77;
      auVar12._12_4_ = iVar77;
      auVar60 = pshufhw(auVar45,auVar12,0x84);
      auVar35 = pshufhw(auVar55,auVar74,0x84);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar35 | auVar60 & auVar55) ^ auVar36;
      auVar55 = packssdw(auVar36,auVar36);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55._0_4_ >> 0x18 & 1) != 0) {
        puVar30[-0xc0] = 0;
      }
      auVar55 = (auVar52 | auVar26) ^ auVar29;
      auVar46._0_4_ = -(uint)(iVar54 < auVar55._0_4_);
      auVar46._4_4_ = -(uint)(iVar57 < auVar55._4_4_);
      auVar46._8_4_ = -(uint)(iVar58 < auVar55._8_4_);
      auVar46._12_4_ = -(uint)(iVar59 < auVar55._12_4_);
      auVar13._4_4_ = auVar46._0_4_;
      auVar13._0_4_ = auVar46._0_4_;
      auVar13._8_4_ = auVar46._8_4_;
      auVar13._12_4_ = auVar46._8_4_;
      auVar60 = pshuflw(auVar74,auVar13,0xe8);
      auVar37._0_4_ = -(uint)(auVar55._0_4_ == iVar54);
      auVar37._4_4_ = -(uint)(auVar55._4_4_ == iVar57);
      auVar37._8_4_ = -(uint)(auVar55._8_4_ == iVar58);
      auVar37._12_4_ = -(uint)(auVar55._12_4_ == iVar59);
      auVar64._4_4_ = auVar37._4_4_;
      auVar64._0_4_ = auVar37._4_4_;
      auVar64._8_4_ = auVar37._12_4_;
      auVar64._12_4_ = auVar37._12_4_;
      auVar55 = pshuflw(auVar37,auVar64,0xe8);
      auVar65._4_4_ = auVar46._4_4_;
      auVar65._0_4_ = auVar46._4_4_;
      auVar65._8_4_ = auVar46._12_4_;
      auVar65._12_4_ = auVar46._12_4_;
      auVar35 = pshuflw(auVar46,auVar65,0xe8);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55 & auVar60,(auVar35 | auVar55 & auVar60) ^ auVar3);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        puVar30[-0xb0] = 0;
      }
      auVar14._4_4_ = auVar46._0_4_;
      auVar14._0_4_ = auVar46._0_4_;
      auVar14._8_4_ = auVar46._8_4_;
      auVar14._12_4_ = auVar46._8_4_;
      auVar65 = auVar64 & auVar14 | auVar65;
      auVar35 = packssdw(auVar65,auVar65);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55,auVar35 ^ auVar4);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55._4_2_ >> 8 & 1) != 0) {
        puVar30[-0xa0] = 0;
      }
      auVar55 = (auVar52 | auVar25) ^ auVar29;
      auVar47._0_4_ = -(uint)(iVar54 < auVar55._0_4_);
      auVar47._4_4_ = -(uint)(iVar57 < auVar55._4_4_);
      auVar47._8_4_ = -(uint)(iVar58 < auVar55._8_4_);
      auVar47._12_4_ = -(uint)(iVar59 < auVar55._12_4_);
      auVar66._4_4_ = auVar47._0_4_;
      auVar66._0_4_ = auVar47._0_4_;
      auVar66._8_4_ = auVar47._8_4_;
      auVar66._12_4_ = auVar47._8_4_;
      iVar73 = -(uint)(auVar55._4_4_ == iVar57);
      iVar77 = -(uint)(auVar55._12_4_ == iVar59);
      auVar15._4_4_ = iVar73;
      auVar15._0_4_ = iVar73;
      auVar15._8_4_ = iVar77;
      auVar15._12_4_ = iVar77;
      auVar75._4_4_ = auVar47._4_4_;
      auVar75._0_4_ = auVar47._4_4_;
      auVar75._8_4_ = auVar47._12_4_;
      auVar75._12_4_ = auVar47._12_4_;
      auVar55 = auVar15 & auVar66 | auVar75;
      auVar55 = packssdw(auVar55,auVar55);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55 ^ auVar5,auVar55 ^ auVar5);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        puVar30[-0x90] = 0;
      }
      auVar55 = pshufhw(auVar55,auVar66,0x84);
      auVar16._4_4_ = iVar73;
      auVar16._0_4_ = iVar73;
      auVar16._8_4_ = iVar77;
      auVar16._12_4_ = iVar77;
      auVar60 = pshufhw(auVar47,auVar16,0x84);
      auVar35 = pshufhw(auVar55,auVar75,0x84);
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar38 = (auVar35 | auVar60 & auVar55) ^ auVar38;
      auVar55 = packssdw(auVar38,auVar38);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55._6_2_ >> 8 & 1) != 0) {
        puVar30[-0x80] = 0;
      }
      auVar55 = (auVar52 | auVar24) ^ auVar29;
      auVar48._0_4_ = -(uint)(iVar54 < auVar55._0_4_);
      auVar48._4_4_ = -(uint)(iVar57 < auVar55._4_4_);
      auVar48._8_4_ = -(uint)(iVar58 < auVar55._8_4_);
      auVar48._12_4_ = -(uint)(iVar59 < auVar55._12_4_);
      auVar17._4_4_ = auVar48._0_4_;
      auVar17._0_4_ = auVar48._0_4_;
      auVar17._8_4_ = auVar48._8_4_;
      auVar17._12_4_ = auVar48._8_4_;
      auVar60 = pshuflw(auVar75,auVar17,0xe8);
      auVar39._0_4_ = -(uint)(auVar55._0_4_ == iVar54);
      auVar39._4_4_ = -(uint)(auVar55._4_4_ == iVar57);
      auVar39._8_4_ = -(uint)(auVar55._8_4_ == iVar58);
      auVar39._12_4_ = -(uint)(auVar55._12_4_ == iVar59);
      auVar67._4_4_ = auVar39._4_4_;
      auVar67._0_4_ = auVar39._4_4_;
      auVar67._8_4_ = auVar39._12_4_;
      auVar67._12_4_ = auVar39._12_4_;
      auVar55 = pshuflw(auVar39,auVar67,0xe8);
      auVar68._4_4_ = auVar48._4_4_;
      auVar68._0_4_ = auVar48._4_4_;
      auVar68._8_4_ = auVar48._12_4_;
      auVar68._12_4_ = auVar48._12_4_;
      auVar35 = pshuflw(auVar48,auVar68,0xe8);
      auVar49._8_4_ = 0xffffffff;
      auVar49._0_8_ = 0xffffffffffffffff;
      auVar49._12_4_ = 0xffffffff;
      auVar49 = (auVar35 | auVar55 & auVar60) ^ auVar49;
      auVar35 = packssdw(auVar49,auVar49);
      auVar55 = packsswb(auVar55 & auVar60,auVar35);
      if ((auVar55 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar30[-0x70] = 0;
      }
      auVar18._4_4_ = auVar48._0_4_;
      auVar18._0_4_ = auVar48._0_4_;
      auVar18._8_4_ = auVar48._8_4_;
      auVar18._12_4_ = auVar48._8_4_;
      auVar68 = auVar67 & auVar18 | auVar68;
      auVar35 = packssdw(auVar68,auVar68);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar6,auVar35 ^ auVar6);
      auVar55 = packsswb(auVar55,auVar35);
      if ((auVar55._8_2_ >> 8 & 1) != 0) {
        puVar30[-0x60] = 0;
      }
      auVar55 = (auVar52 | auVar23) ^ auVar29;
      auVar50._0_4_ = -(uint)(iVar54 < auVar55._0_4_);
      auVar50._4_4_ = -(uint)(iVar57 < auVar55._4_4_);
      auVar50._8_4_ = -(uint)(iVar58 < auVar55._8_4_);
      auVar50._12_4_ = -(uint)(iVar59 < auVar55._12_4_);
      auVar69._4_4_ = auVar50._0_4_;
      auVar69._0_4_ = auVar50._0_4_;
      auVar69._8_4_ = auVar50._8_4_;
      auVar69._12_4_ = auVar50._8_4_;
      iVar73 = -(uint)(auVar55._4_4_ == iVar57);
      iVar77 = -(uint)(auVar55._12_4_ == iVar59);
      auVar19._4_4_ = iVar73;
      auVar19._0_4_ = iVar73;
      auVar19._8_4_ = iVar77;
      auVar19._12_4_ = iVar77;
      auVar76._4_4_ = auVar50._4_4_;
      auVar76._0_4_ = auVar50._4_4_;
      auVar76._8_4_ = auVar50._12_4_;
      auVar76._12_4_ = auVar50._12_4_;
      auVar55 = auVar19 & auVar69 | auVar76;
      auVar55 = packssdw(auVar55,auVar55);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55 ^ auVar7,auVar55 ^ auVar7);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        puVar30[-0x50] = 0;
      }
      auVar55 = pshufhw(auVar55,auVar69,0x84);
      auVar20._4_4_ = iVar73;
      auVar20._0_4_ = iVar73;
      auVar20._8_4_ = iVar77;
      auVar20._12_4_ = iVar77;
      auVar60 = pshufhw(auVar50,auVar20,0x84);
      auVar35 = pshufhw(auVar55,auVar76,0x84);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar40 = (auVar35 | auVar60 & auVar55) ^ auVar40;
      auVar55 = packssdw(auVar40,auVar40);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55._10_2_ >> 8 & 1) != 0) {
        puVar30[-0x40] = 0;
      }
      auVar55 = (auVar52 | _DAT_0011fe60) ^ auVar29;
      auVar51._0_4_ = -(uint)(iVar54 < auVar55._0_4_);
      auVar51._4_4_ = -(uint)(iVar57 < auVar55._4_4_);
      auVar51._8_4_ = -(uint)(iVar58 < auVar55._8_4_);
      auVar51._12_4_ = -(uint)(iVar59 < auVar55._12_4_);
      auVar21._4_4_ = auVar51._0_4_;
      auVar21._0_4_ = auVar51._0_4_;
      auVar21._8_4_ = auVar51._8_4_;
      auVar21._12_4_ = auVar51._8_4_;
      auVar60 = pshuflw(auVar76,auVar21,0xe8);
      auVar41._0_4_ = -(uint)(auVar55._0_4_ == iVar54);
      auVar41._4_4_ = -(uint)(auVar55._4_4_ == iVar57);
      auVar41._8_4_ = -(uint)(auVar55._8_4_ == iVar58);
      auVar41._12_4_ = -(uint)(auVar55._12_4_ == iVar59);
      auVar70._4_4_ = auVar41._4_4_;
      auVar70._0_4_ = auVar41._4_4_;
      auVar70._8_4_ = auVar41._12_4_;
      auVar70._12_4_ = auVar41._12_4_;
      auVar55 = pshuflw(auVar41,auVar70,0xe8);
      auVar71._4_4_ = auVar51._4_4_;
      auVar71._0_4_ = auVar51._4_4_;
      auVar71._8_4_ = auVar51._12_4_;
      auVar71._12_4_ = auVar51._12_4_;
      auVar35 = pshuflw(auVar51,auVar71,0xe8);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55 & auVar60,(auVar35 | auVar55 & auVar60) ^ auVar8);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        puVar30[-0x30] = 0;
      }
      auVar22._4_4_ = auVar51._0_4_;
      auVar22._0_4_ = auVar51._0_4_;
      auVar22._8_4_ = auVar51._8_4_;
      auVar22._12_4_ = auVar51._8_4_;
      auVar71 = auVar70 & auVar22 | auVar71;
      auVar35 = packssdw(auVar71,auVar71);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55,auVar35 ^ auVar9);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55._12_2_ >> 8 & 1) != 0) {
        puVar30[-0x20] = 0;
      }
      auVar55 = (auVar52 | _DAT_0011fe50) ^ auVar29;
      auVar42._0_4_ = -(uint)(iVar54 < auVar55._0_4_);
      auVar42._4_4_ = -(uint)(iVar57 < auVar55._4_4_);
      auVar42._8_4_ = -(uint)(iVar58 < auVar55._8_4_);
      auVar42._12_4_ = -(uint)(iVar59 < auVar55._12_4_);
      auVar72._4_4_ = auVar42._0_4_;
      auVar72._0_4_ = auVar42._0_4_;
      auVar72._8_4_ = auVar42._8_4_;
      auVar72._12_4_ = auVar42._8_4_;
      auVar53._4_4_ = -(uint)(auVar55._4_4_ == iVar57);
      auVar53._12_4_ = -(uint)(auVar55._12_4_ == iVar59);
      auVar53._0_4_ = auVar53._4_4_;
      auVar53._8_4_ = auVar53._12_4_;
      auVar56._4_4_ = auVar42._4_4_;
      auVar56._0_4_ = auVar42._4_4_;
      auVar56._8_4_ = auVar42._12_4_;
      auVar56._12_4_ = auVar42._12_4_;
      auVar35 = auVar53 & auVar72 | auVar56;
      auVar55 = packssdw(auVar42,auVar35);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar55 = packssdw(auVar55 ^ auVar10,auVar55 ^ auVar10);
      auVar55 = packsswb(auVar55,auVar55);
      if ((auVar55 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        puVar30[-0x10] = 0;
      }
      auVar55 = pshufhw(auVar55,auVar72,0x84);
      auVar35 = pshufhw(auVar35,auVar53,0x84);
      in_XMM2 = auVar35 & auVar55;
      auVar55 = pshufhw(auVar55,auVar56,0x84);
      auVar43._8_4_ = 0xffffffff;
      auVar43._0_8_ = 0xffffffffffffffff;
      auVar43._12_4_ = 0xffffffff;
      auVar43 = (auVar55 | in_XMM2) ^ auVar43;
      auVar55 = packssdw(auVar43,auVar43);
      in_XMM1 = packsswb(auVar55,auVar55);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        *puVar30 = 0;
      }
      uVar32 = uVar32 + 0x10;
      puVar30 = puVar30 + 0x100;
    } while ((lVar33 + 0xfU & 0xfffffffffffffff0) != uVar32);
  }
  return;
}

Assistant:

void luaT_getvarargs (lua_State *L, CallInfo *ci, StkId where, int wanted) {
  int i;
  int nextra = ci->u.l.nextraargs;
  if (wanted < 0) {
    wanted = nextra;  /* get all extra arguments available */
    checkstackGCp(L, nextra, where);  /* ensure stack space */
    L->top.p = where + nextra;  /* next instruction will need top */
  }
  for (i = 0; i < wanted && i < nextra; i++)
    setobjs2s(L, where + i, ci->func.p - nextra + i);
  for (; i < wanted; i++)   /* complete required results with nil */
    setnilvalue(s2v(where + i));
}